

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O2

S2CellUnion * __thiscall
S2CellUnion::Union(S2CellUnion *__return_storage_ptr__,S2CellUnion *this,S2CellUnion *y)

{
  vector<S2CellId,_std::allocator<S2CellId>_> cell_ids;
  _Vector_base<S2CellId,_std::allocator<S2CellId>_> local_58;
  _Vector_base<S2CellId,_std::allocator<S2CellId>_> local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (S2CellId *)0x0;
  std::vector<S2CellId,_std::allocator<S2CellId>_>::reserve
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)&local_58,
             (long)((int)((ulong)((long)(y->cell_ids_).
                                        super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(y->cell_ids_).
                                       super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 3) +
                   (int)((ulong)((long)(this->cell_ids_).
                                       super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->cell_ids_).
                                      super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3)));
  std::vector<S2CellId,_std::allocator<S2CellId>_>::operator=
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)&local_58,&this->cell_ids_);
  std::vector<S2CellId,std::allocator<S2CellId>>::
  insert<__gnu_cxx::__normal_iterator<S2CellId_const*,std::vector<S2CellId,std::allocator<S2CellId>>>,void>
            ((vector<S2CellId,std::allocator<S2CellId>> *)&local_58,
             (const_iterator)local_58._M_impl.super__Vector_impl_data._M_finish,
             (y->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_start,
             (y->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_finish);
  local_38._M_impl.super__Vector_impl_data._M_start =
       local_58._M_impl.super__Vector_impl_data._M_start;
  local_38._M_impl.super__Vector_impl_data._M_finish =
       local_58._M_impl.super__Vector_impl_data._M_finish;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  S2CellUnion(__return_storage_ptr__,(vector<S2CellId,_std::allocator<S2CellId>_> *)&local_38);
  std::_Vector_base<S2CellId,_std::allocator<S2CellId>_>::~_Vector_base(&local_38);
  std::_Vector_base<S2CellId,_std::allocator<S2CellId>_>::~_Vector_base(&local_58);
  return __return_storage_ptr__;
}

Assistant:

S2CellUnion S2CellUnion::Union(const S2CellUnion& y) const {
  vector<S2CellId> cell_ids;
  cell_ids.reserve(num_cells() + y.num_cells());
  cell_ids = cell_ids_;
  cell_ids.insert(cell_ids.end(), y.cell_ids_.begin(), y.cell_ids_.end());
  return S2CellUnion(std::move(cell_ids));
}